

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_no_fut.cc
# Opt level: O3

void hello(int a,int b,int c)

{
  ostream *poVar1;
  char local_1b [3];
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,a);
  local_1b[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,b);
  local_1b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c);
  local_1b[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b + 2,1);
  return;
}

Assistant:

static void hello(int a, int b, int c)
{
    std::cout << a << ' ' << b << ' ' << c << '\n';
}